

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

void __thiscall
DSectorPlaneInterpolation::DSectorPlaneInterpolation
          (DSectorPlaneInterpolation *this,sector_t *_sector,bool _plane,bool attach)

{
  undefined3 in_register_00000009;
  
  DInterpolation::DInterpolation(&this->super_DInterpolation);
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_007ea410;
  (this->attached).Array = (DInterpolation **)0x0;
  (this->attached).Most = 0;
  (this->attached).Count = 0;
  this->sector = _sector;
  this->ceiling = _plane;
  UpdateInterpolation(this);
  if (CONCAT31(in_register_00000009,attach) != 0) {
    P_Start3dMidtexInterpolations(&this->attached,this->sector,this->ceiling);
    P_StartLinkedSectorInterpolations(&this->attached,this->sector,this->ceiling);
  }
  FInterpolator::AddInterpolation(&interpolator,&this->super_DInterpolation);
  return;
}

Assistant:

DSectorPlaneInterpolation::DSectorPlaneInterpolation(sector_t *_sector, bool _plane, bool attach)
{
	sector = _sector;
	ceiling = _plane;
	UpdateInterpolation ();

	if (attach)
	{
		P_Start3dMidtexInterpolations(attached, sector, ceiling);
		P_StartLinkedSectorInterpolations(attached, sector, ceiling);
	}
	interpolator.AddInterpolation(this);
}